

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapElements
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index1,
          int index2)

{
  bool bVar1;
  Label LVar2;
  int number;
  CppType CVar3;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  RepeatedField<long> *this_01;
  RepeatedField<unsigned_int> *this_02;
  RepeatedField<unsigned_long> *this_03;
  RepeatedField<double> *this_04;
  RepeatedField<float> *this_05;
  RepeatedField<bool> *this_06;
  RepeatedField<int> *pRVar5;
  RepeatedPtrFieldBase *this_07;
  int index2_local;
  int index1_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap",
               "Field is singular; the method requires a repeated field.");
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    ExtensionSet::SwapElements(this_00,number,index1,index2);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type(field);
    switch(CVar3) {
    case CPPTYPE_INT32:
      pRVar5 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      RepeatedField<int>::SwapElements(pRVar5,index1,index2);
      break;
    case CPPTYPE_INT64:
      this_01 = MutableRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      RepeatedField<long>::SwapElements(this_01,index1,index2);
      break;
    case CPPTYPE_UINT32:
      this_02 = MutableRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      RepeatedField<unsigned_int>::SwapElements(this_02,index1,index2);
      break;
    case CPPTYPE_UINT64:
      this_03 = MutableRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      RepeatedField<unsigned_long>::SwapElements(this_03,index1,index2);
      break;
    case CPPTYPE_DOUBLE:
      this_04 = MutableRaw<google::protobuf::RepeatedField<double>>(this,message,field);
      RepeatedField<double>::SwapElements(this_04,index1,index2);
      break;
    case CPPTYPE_FLOAT:
      this_05 = MutableRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      RepeatedField<float>::SwapElements(this_05,index1,index2);
      break;
    case CPPTYPE_BOOL:
      this_06 = MutableRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      RepeatedField<bool>::SwapElements(this_06,index1,index2);
      break;
    case CPPTYPE_ENUM:
      pRVar5 = MutableRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      RepeatedField<int>::SwapElements(pRVar5,index1,index2);
      break;
    case CPPTYPE_STRING:
    case CPPTYPE_MESSAGE:
      this_07 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
      RepeatedPtrFieldBase::SwapElements(this_07,index1,index2);
    }
  }
  return;
}

Assistant:

void GeneratedMessageReflection::SwapElements(
    Message* message,
    const FieldDescriptor* field,
    int index1,
    int index2) const {
  USAGE_CHECK_MESSAGE_TYPE(Swap);
  USAGE_CHECK_REPEATED(Swap);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SwapElements(field->number(), index1, index2);
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
      case FieldDescriptor::CPPTYPE_##UPPERCASE :                             \
        MutableRaw<RepeatedField<LOWERCASE> >(message, field)                 \
            ->SwapElements(index1, index2);                                   \
        break

      HANDLE_TYPE( INT32,  int32);
      HANDLE_TYPE( INT64,  int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE( FLOAT,  float);
      HANDLE_TYPE(  BOOL,   bool);
      HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        MutableRaw<RepeatedPtrFieldBase>(message, field)
            ->SwapElements(index1, index2);
        break;
    }
  }
}